

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.hpp
# Opt level: O3

void __thiscall duckdb_re2::Regex::Regex(Regex *this,char *pattern,RegexOptions options)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,pattern,&local_31);
  Regex(this,&local_30,NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit Regex(const char *pattern, RegexOptions options = RegexOptions::NONE) : Regex(std::string(pattern)) {
	}